

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.cpp
# Opt level: O3

void __thiscall
Js::PropertyRecordUsageCache::PropertyRecordUsageCache
          (PropertyRecordUsageCache *this,StaticType *type,PropertyRecord *propertyRecord)

{
  ScriptContextPolymorphicInlineCache *pSVar1;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->propertyRecord).ptr = propertyRecord;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->ldElemInlineCache).ptr = (PolymorphicInlineCache *)0x0;
  (this->stElemInlineCache).ptr = (PolymorphicInlineCache *)0x0;
  this->hitRate = 0;
  pSVar1 = ScriptContextPolymorphicInlineCache::New(1,(type->super_Type).javascriptLibrary.ptr);
  Memory::Recycler::WBSetBit((char *)&this->ldElemInlineCache);
  (this->ldElemInlineCache).ptr = &pSVar1->super_PolymorphicInlineCache;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->ldElemInlineCache);
  pSVar1 = ScriptContextPolymorphicInlineCache::New(1,(type->super_Type).javascriptLibrary.ptr);
  Memory::Recycler::WBSetBit((char *)&this->stElemInlineCache);
  (this->stElemInlineCache).ptr = &pSVar1->super_PolymorphicInlineCache;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->stElemInlineCache);
  return;
}

Assistant:

PropertyRecordUsageCache::PropertyRecordUsageCache(StaticType* type, const PropertyRecord* propertyRecord) :
        propertyRecord(propertyRecord),
        ldElemInlineCache(nullptr),
        stElemInlineCache(nullptr),
        hitRate(0)
    {
        // TODO: in future, might be worth putting these inline to avoid extra allocations. PIC copy API needs to be updated to support this though
        this->ldElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
        this->stElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
    }